

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNAccu.h
# Opt level: O0

void __thiscall NaPNAccumulator::~NaPNAccumulator(NaPNAccumulator *this)

{
  NaPetriCnOutput *in_RDI;
  
  (in_RDI->super_NaPetriConnector)._vptr_NaPetriConnector =
       (_func_int **)&PTR__NaPNAccumulator_00198860;
  NaVector::~NaVector((NaVector *)in_RDI);
  NaPetriCnOutput::~NaPetriCnOutput(in_RDI);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)0x17e79c);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  return;
}

Assistant:

class PNNA_API NaPNAccumulator : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNAccumulator (const char* szNodeName = "accumulator");


    ////////////////
    // Connectors //
    ////////////////

    // Input (mainstream)
    NaPetriCnInput      in;

    // Output (mainstream)
    NaPetriCnOutput     sum;


    ///////////////////
    // Node specific //
    ///////////////////

    // Assign depth of accumulation of input values; 0 means infinity
    virtual void	set_accum_depth (unsigned nDepth);

    // Get depth of accumulation of input values; 0 means infinity
    virtual unsigned	get_accum_depth () const;


    // Reset accumulated sum (make it zero).
    virtual void	reset_accum ();


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 6. Initialize node activity and setup starter flag if needed
    virtual void        initialize (bool& starter);

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:/* data */

    // Cyclic buffer (depth size) for storing input values to have sum
    // of them.
    NaVector		vBuffer;

    // Index of next value to store input, so the previous one should
    // be subtracted from sum.
    unsigned		iNext;

    // Current value of accumulator
    NaReal		fSum;
}